

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O1

IRet * __thiscall
deqp::gls::BuiltinPrecisionTests::Functions::GenVec<float,_4>::doApply
          (IRet *__return_storage_ptr__,GenVec<float,_4> *this,EvalContext *param_1,IArgs *iargs)

{
  Interval *pIVar1;
  Interval *pIVar2;
  Interval *pIVar3;
  Interval *pIVar4;
  double dVar5;
  undefined7 uVar6;
  long lVar7;
  
  pIVar1 = iargs->a;
  pIVar2 = iargs->b;
  pIVar3 = iargs->c;
  pIVar4 = iargs->d;
  lVar7 = 0x10;
  do {
    *(undefined1 *)((long)__return_storage_ptr__->m_data + lVar7 + -0x10) = 0;
    *(undefined8 *)((long)__return_storage_ptr__->m_data + lVar7 + -8) = 0x7ff0000000000000;
    *(undefined8 *)(&__return_storage_ptr__->m_data[0].m_hasNaN + lVar7) = 0xfff0000000000000;
    lVar7 = lVar7 + 0x18;
  } while (lVar7 != 0x70);
  __return_storage_ptr__->m_data[0].m_hi = pIVar1->m_hi;
  uVar6 = *(undefined7 *)&pIVar1->field_0x1;
  dVar5 = pIVar1->m_lo;
  __return_storage_ptr__->m_data[0].m_hasNaN = pIVar1->m_hasNaN;
  *(undefined7 *)&__return_storage_ptr__->m_data[0].field_0x1 = uVar6;
  __return_storage_ptr__->m_data[0].m_lo = dVar5;
  __return_storage_ptr__->m_data[1].m_hi = pIVar2->m_hi;
  uVar6 = *(undefined7 *)&pIVar2->field_0x1;
  dVar5 = pIVar2->m_lo;
  __return_storage_ptr__->m_data[1].m_hasNaN = pIVar2->m_hasNaN;
  *(undefined7 *)&__return_storage_ptr__->m_data[1].field_0x1 = uVar6;
  __return_storage_ptr__->m_data[1].m_lo = dVar5;
  uVar6 = *(undefined7 *)&pIVar3->field_0x1;
  dVar5 = pIVar3->m_lo;
  __return_storage_ptr__->m_data[2].m_hasNaN = pIVar3->m_hasNaN;
  *(undefined7 *)&__return_storage_ptr__->m_data[2].field_0x1 = uVar6;
  __return_storage_ptr__->m_data[2].m_lo = dVar5;
  __return_storage_ptr__->m_data[2].m_hi = pIVar3->m_hi;
  uVar6 = *(undefined7 *)&pIVar4->field_0x1;
  dVar5 = pIVar4->m_lo;
  __return_storage_ptr__->m_data[3].m_hasNaN = pIVar4->m_hasNaN;
  *(undefined7 *)&__return_storage_ptr__->m_data[3].field_0x1 = uVar6;
  __return_storage_ptr__->m_data[3].m_lo = dVar5;
  __return_storage_ptr__->m_data[3].m_hi = pIVar4->m_hi;
  return __return_storage_ptr__;
}

Assistant:

IRet		doApply		(const EvalContext&, const IArgs& iargs) const
	{
		return IRet(iargs.a, iargs.b, iargs.c, iargs.d);
	}